

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_1::validateSortedAtomicRampAdditionValueChain
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *valueChain,deUint32 sumValue,
               int *invalidOperationNdx,deUint32 *errorDelta,deUint32 *errorExpected)

{
  pointer puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  deUint32 dVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainDelta;
  allocator_type local_49;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
             (long)(valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2,&local_49);
  puVar1 = (valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 2;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    dVar6 = sumValue;
    if ((uVar3 & 0xffffffff) - 1 != uVar5) {
      dVar6 = puVar1[uVar5 + 1];
    }
    local_48._M_impl.super__Vector_impl_data._M_start[uVar5] = dVar6 - puVar1[uVar5];
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ();
  uVar3 = (ulong)((long)(valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(valueChain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                       ._M_impl.super__Vector_impl_data._M_start) >> 2;
  iVar2 = (int)uVar3;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < iVar2) {
    uVar5 = uVar3 & 0xffffffff;
  }
  do {
    uVar3 = uVar4;
    if (uVar5 == uVar3) goto LAB_00494c1c;
    uVar4 = uVar3 + 1;
  } while (uVar4 == local_48._M_impl.super__Vector_impl_data._M_start[uVar3]);
  *invalidOperationNdx = (deUint32)uVar4 - 1;
  *errorDelta = local_48._M_impl.super__Vector_impl_data._M_start[uVar3];
  *errorExpected = (deUint32)uVar4;
LAB_00494c1c:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return (long)iVar2 <= (long)uVar3;
}

Assistant:

static bool validateSortedAtomicRampAdditionValueChain (const std::vector<deUint32>& valueChain, deUint32 sumValue, int& invalidOperationNdx, deUint32& errorDelta, deUint32& errorExpected)
{
	std::vector<deUint32> chainDelta(valueChain.size());

	for (int callNdx = 0; callNdx < (int)valueChain.size(); ++callNdx)
		chainDelta[callNdx] = ((callNdx + 1 == (int)valueChain.size()) ? (sumValue) : (valueChain[callNdx+1])) - valueChain[callNdx];

	// chainDelta contains now the actual additions applied to the value
	// check there exists an addition ramp form 1 to ...
	std::sort(chainDelta.begin(), chainDelta.end());

	for (int callNdx = 0; callNdx < (int)valueChain.size(); ++callNdx)
	{
		if ((int)chainDelta[callNdx] != callNdx+1)
		{
			invalidOperationNdx = callNdx;
			errorDelta = chainDelta[callNdx];
			errorExpected = callNdx+1;

			return false;
		}
	}

	return true;
}